

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# update_segment.cpp
# Opt level: O1

void duckdb::TemplatedFetchCommitted<long>(UpdateInfo *info,Vector *result)

{
  uint uVar1;
  data_ptr_t __dest;
  ulong uVar2;
  ulong uVar3;
  
  __dest = result->data;
  uVar2 = (ulong)info->N;
  uVar1 = info->max;
  if (uVar2 == 0x800) {
    switchD_015ff80e::default(__dest,(void *)((long)&info[1].segment + (ulong)uVar1 * 4),0x4000);
    return;
  }
  if (uVar2 != 0) {
    uVar3 = 0;
    do {
      *(undefined8 *)(__dest + (ulong)*(uint *)((long)&info[1].segment + uVar3 * 4) * 8) =
           *(undefined8 *)((long)&info[1].segment + uVar3 * 8 + (ulong)uVar1 * 4);
      uVar3 = uVar3 + 1;
    } while (uVar2 != uVar3);
  }
  return;
}

Assistant:

static void TemplatedFetchCommitted(UpdateInfo &info, Vector &result) {
	auto result_data = FlatVector::GetData<T>(result);
	MergeUpdateInfo<T>(info, result_data);
}